

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O2

void __thiscall
duckdb_shell::ModeTableRenderer::RenderHeader(ModeTableRenderer *this,ColumnarResult *result)

{
  char *str;
  idx_t i;
  ulong i_00;
  
  ShellState::PrintRowSeparator
            ((this->super_ColumnRenderer).super_ShellRenderer.state,result->column_count,"+",
             &result->column_width);
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"| ");
  for (i_00 = 0; i_00 < result->column_count; i_00 = i_00 + 1) {
    ColumnRenderer::RenderAlignedValue(&this->super_ColumnRenderer,result,i_00);
    str = " | ";
    if (i_00 == result->column_count - 1) {
      str = " |\n";
    }
    ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,str);
  }
  ShellState::PrintRowSeparator
            ((this->super_ColumnRenderer).super_ShellRenderer.state,result->column_count,"+",
             &result->column_width);
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		state.PrintRowSeparator(result.column_count, "+", result.column_width);
		state.Print("| ");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? " |\n" : " | ");
		}
		state.PrintRowSeparator(result.column_count, "+", result.column_width);
	}